

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall nonius::junit_reporter::do_benchmark_failure(junit_reporter *this,exception_ptr *e)

{
  pointer pdVar1;
  pointer pdVar2;
  void *pvVar3;
  void *pvVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  void *__tmp;
  long lVar7;
  rep *prVar8;
  estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *peVar9;
  byte bVar10;
  rep arStack_80 [12];
  void *local_20;
  
  bVar10 = 0;
  arStack_80[9] = 0.0;
  arStack_80[10] = 0.0;
  arStack_80[7] = 0.0;
  arStack_80[8] = 0.0;
  arStack_80[5] = 0.0;
  arStack_80[6] = 0.0;
  arStack_80[3] = 0.0;
  arStack_80[4] = 0.0;
  arStack_80[1] = 0.0;
  arStack_80[2] = 0.0;
  arStack_80[0] = 0.0;
  arStack_80[0xb] = 0.0;
  local_20 = e->_M_exception_object;
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->data,&this->current);
  pdVar1 = (pmVar5->analysis).samples.
           super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (pmVar5->analysis).samples.
           super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar5->analysis).samples.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar5->analysis).samples.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar5->analysis).samples.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
  }
  pvVar4 = local_20;
  prVar8 = arStack_80;
  peVar9 = &(pmVar5->analysis).mean;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    (peVar9->point).__r = *prVar8;
    prVar8 = prVar8 + (ulong)bVar10 * -2 + 1;
    peVar9 = (estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)
             ((long)peVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  local_20 = (void *)0x0;
  pvVar3 = (pmVar5->failure)._M_exception_object;
  (pmVar5->failure)._M_exception_object = pvVar4;
  if (pvVar3 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->current)._M_dataplus._M_p,
                      (this->current)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," failed to run successfully\n",0x1c);
  return;
}

Assistant:

void do_benchmark_failure(std::exception_ptr e) override {
            data[current] = { sample_analysis<fp_seconds>(), e };
            error_stream() << current << " failed to run successfully\n";
        }